

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O1

int libpd_sysex(int port,int byte)

{
  int iVar1;
  
  iVar1 = -1;
  if ((uint)byte < 0x100 && (uint)port < 0x1000) {
    sys_lock();
    inmidi_sysex(port,byte);
    sys_unlock();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int libpd_sysex(int port, int byte) {
  CHECK_PORT
  CHECK_RANGE_8BIT(byte)
  sys_lock();
  inmidi_sysex(port, byte);
  sys_unlock();
  return 0;
}